

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O2

void __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::bubbleUp
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode)

{
  bool bVar1;
  
  do {
    if (pNode->pParent == (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
LAB_00103fee:
      bVar1 = isHead(this,pNode,this->_pHead);
      if (bVar1) {
        this->_pHead = pNode;
      }
      return;
    }
    bVar1 = isHead(this,pNode,pNode->pParent);
    if (!bVar1) {
      if (pNode->pParent != (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
        return;
      }
      goto LAB_00103fee;
    }
    swap(this,pNode,pNode->pParent);
  } while( true );
}

Assistant:

void BHeap<T, Comparator>::bubbleUp (BNode<T> *pNode)
    {
        while (pNode->pParent != NULL) {
            if (isHead (pNode, pNode->pParent))
                swap (pNode, pNode->pParent);
            else
                break;
        }

        if (pNode->pParent == NULL)
            /* it made it to the root - it may be the new head */
            if (isHead (pNode, _pHead))
                _pHead = pNode;
    }